

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Signal_PDU.cpp
# Opt level: O2

void __thiscall
KDIS::PDU::Signal_PDU::Decode(Signal_PDU *this,KDataStream *stream,bool ignoreHeader)

{
  ushort uVar1;
  KUINT16 KVar2;
  KException *this_00;
  int iVar3;
  undefined7 in_register_00000011;
  ushort uVar4;
  short sVar5;
  bool bVar6;
  allocator<char> local_41;
  KOCTET o;
  
  KVar2 = KDataStream::GetBufferSize(stream);
  iVar3 = 0xc;
  if ((int)CONCAT71(in_register_00000011,ignoreHeader) == 0) {
    iVar3 = 0;
  }
  if (0x1f < iVar3 + (uint)KVar2) {
    Radio_Communications_Header::Decode
              (&this->super_Radio_Communications_Header,stream,ignoreHeader);
    (*(this->m_EncodingScheme).super_DataTypeBase._vptr_DataTypeBase[3])
              (&this->m_EncodingScheme,stream);
    KDataStream::Read<unsigned_int>(stream,&this->m_ui32SampleRate);
    KDataStream::Read<unsigned_short>(stream,&this->m_ui16DataLength);
    KDataStream::Read<unsigned_short>(stream,&this->m_ui16Samples);
    uVar1 = this->m_ui16DataLength >> 3;
    uVar4 = 4 - (uVar1 & 3);
    if ((uVar1 & 3) == 0) {
      uVar4 = uVar1 & 3;
    }
    sVar5 = uVar4 + uVar1;
    while (bVar6 = sVar5 != 0, sVar5 = sVar5 + -1, bVar6) {
      KDataStream::Read(stream,&o);
      std::vector<char,_std::allocator<char>_>::push_back(&this->m_vData,&o);
    }
    return;
  }
  this_00 = (KException *)__cxa_allocate_exception(0x30);
  std::__cxx11::string::string<std::allocator<char>>((string *)&o,"Decode",&local_41);
  KException::KException(this_00,(KString *)&o,2);
  __cxa_throw(this_00,&KException::typeinfo,KException::~KException);
}

Assistant:

void Signal_PDU::Decode(KDataStream &stream, bool ignoreHeader /*= true*/ ) noexcept(false)
{
    if( ( stream.GetBufferSize() + ( ignoreHeader ? Header::HEADER6_PDU_SIZE : 0 ) ) < SIGNAL_PDU_SIZE )throw KException( __FUNCTION__, NOT_ENOUGH_DATA_IN_BUFFER );

    Radio_Communications_Header::Decode( stream, ignoreHeader );

    stream >> KDIS_STREAM m_EncodingScheme
           >> m_ui32SampleRate
           >> m_ui16DataLength
           >> m_ui16Samples;

    KUINT16 dl =  m_ui16DataLength / 8;
    dl += ( dl % 4 == 0 ? 0 : ( 4 - dl % 4 ) ); // Add padding
    for( KUINT16 i = 0; i < dl; ++i )
    {
        KOCTET o;
        stream >> o;
        m_vData.push_back( o );
    }
}